

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_confirm_host_header(lws *wsi)

{
  lws_vhost *plVar1;
  int iVar2;
  uint uVar3;
  lws_tokenize_elem lVar4;
  uint uVar5;
  char *pcVar6;
  lws_tokenize ts;
  char buf [128];
  lws_tokenize local_d0;
  char local_a8 [128];
  
  iVar2 = lws_hdr_total_length(wsi,WSI_TOKEN_HOST);
  if (iVar2 == 0) {
    pcVar6 = "%s: missing host on upgrade\n";
  }
  else {
    uVar5 = 0x1bb;
    if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
      uVar5 = 0x50;
    }
    lws_tokenize_init(&local_d0,local_a8,0x31);
    uVar3 = lws_hdr_copy(wsi,local_a8,0x7f,WSI_TOKEN_HOST);
    if ((int)uVar3 < 1) {
      pcVar6 = "%s: missing or oversize host header\n";
    }
    else {
      local_d0.len = (size_t)uVar3;
      lVar4 = lws_tokenize(&local_d0);
      pcVar6 = local_d0.token;
      if (lVar4 == LWS_TOKZE_TOKEN) {
        plVar1 = (wsi->a).vhost;
        iVar2 = strncmp(local_d0.token,plVar1->name,local_d0.token_len);
        if (iVar2 != 0) {
          pcVar6[local_d0.token_len] = '\0';
          _lws_log(8,"%s: \'%s\' in host hdr but vhost name %s\n","lws_confirm_host_header",pcVar6,
                   plVar1->name);
          return 1;
        }
        lVar4 = lws_tokenize(&local_d0);
        if (lVar4 == LWS_TOKZE_ENDED) {
LAB_001209a4:
          if (((wsi->a).vhost)->listen_port != uVar5) {
            _lws_log(8,"%s: host port %d mismatches vhost port %d\n","lws_confirm_host_header",
                     (ulong)uVar5);
            return 1;
          }
          _lws_log(0x10,"%s: host header OK\n","lws_confirm_host_header");
          return 0;
        }
        if (((lVar4 == LWS_TOKZE_DELIMITER) && (*local_d0.token == ':')) &&
           (lVar4 = lws_tokenize(&local_d0), lVar4 == LWS_TOKZE_INTEGER)) {
          uVar5 = atoi(local_d0.token);
          goto LAB_001209a4;
        }
      }
      pcVar6 = "%s: bad host header format\n";
    }
  }
  _lws_log(8,pcVar6,"lws_confirm_host_header");
  return 1;
}

Assistant:

int
lws_confirm_host_header(struct lws *wsi)
{
	struct lws_tokenize ts;
	lws_tokenize_elem e;
	int port = 80, n;
	char buf[128];

	/*
	 * this vhost wants us to validate what the
	 * client sent against our vhost name
	 */

	if (!lws_hdr_total_length(wsi, WSI_TOKEN_HOST)) {
		lwsl_info("%s: missing host on upgrade\n", __func__);

		return 1;
	}

#if defined(LWS_WITH_TLS)
	if (wsi->tls.ssl)
		port = 443;
#endif

	lws_tokenize_init(&ts, buf, LWS_TOKENIZE_F_DOT_NONTERM /* server.com */|
				    LWS_TOKENIZE_F_NO_FLOATS /* 1.server.com */|
				    LWS_TOKENIZE_F_MINUS_NONTERM /* a-b.com */);
	n = lws_hdr_copy(wsi, buf, sizeof(buf) - 1, WSI_TOKEN_HOST);
	if (n <= 0) {
		lwsl_info("%s: missing or oversize host header\n", __func__);
		return 1;
	}
	ts.len = (size_t)n;

	if (lws_tokenize(&ts) != LWS_TOKZE_TOKEN)
		goto bad_format;

	if (strncmp(ts.token, wsi->a.vhost->name, ts.token_len)) {
		buf[(size_t)(ts.token - buf) + ts.token_len] = '\0';
		lwsl_info("%s: '%s' in host hdr but vhost name %s\n",
			  __func__, ts.token, wsi->a.vhost->name);
		return 1;
	}

	e = lws_tokenize(&ts);
	if (e == LWS_TOKZE_DELIMITER && ts.token[0] == ':') {
		if (lws_tokenize(&ts) != LWS_TOKZE_INTEGER)
			goto bad_format;
		else
			port = atoi(ts.token);
	} else
		if (e != LWS_TOKZE_ENDED)
			goto bad_format;

	if (wsi->a.vhost->listen_port != port) {
		lwsl_info("%s: host port %d mismatches vhost port %d\n",
			  __func__, port, wsi->a.vhost->listen_port);
		return 1;
	}

	lwsl_debug("%s: host header OK\n", __func__);

	return 0;

bad_format:
	lwsl_info("%s: bad host header format\n", __func__);

	return 1;
}